

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>::
fastAccessDx(FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
             *this,int i)

{
  undefined4 in_EDX;
  Fad<double> *in_RSI;
  Fad<double> *in_RDI;
  Fad<double> *this_00;
  Fad<double> local_40;
  undefined4 in_stack_ffffffffffffffe8;
  
  this_00 = &local_40;
  FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>::fastAccessDx
            ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)this_00,
             (int)((ulong)in_RDI >> 0x20));
  Fad<double>::operator-(this_00);
  Fad<double>::Fad<FadUnaryMin<Fad<double>>>
            (in_RSI,(FadExpr<FadUnaryMin<Fad<double>_>_> *)
                    CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x1eaf825);
  Fad<double>::~Fad(in_RDI);
  return in_RDI;
}

Assistant:

value_type fastAccessDx(int i) const { return - right_.fastAccessDx(i);}